

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  UConverterSharedData *pUVar5;
  byte *pbVar6;
  UBool UVar7;
  uint8_t uVar8;
  undefined8 in_RAX;
  undefined7 uVar11;
  ulong uVar9;
  ulong uVar10;
  UErrorCode UVar12;
  uint uVar13;
  uint uVar14;
  UConverter *cnv;
  long lVar15;
  uint32_t prev;
  int iVar16;
  undefined8 in_R8;
  uint uVar17;
  UConverter *pUVar18;
  byte *pbVar19;
  byte *pbVar20;
  uint8_t *puStack_c0;
  uint8_t *target;
  uint local_a4;
  UConverterToUnicodeArgs *local_a0;
  uint local_94;
  long local_90;
  byte *local_88;
  byte *local_80;
  ushort *local_78;
  UConverterFromUnicodeArgs *local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  UErrorCode *local_58;
  UConverter *local_50;
  UConverter *local_48;
  uint16_t *local_40;
  UChar *noSource;
  
  pUVar18 = pToUArgs->converter;
  pbVar19 = (byte *)pToUArgs->source;
  cnv = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  local_88 = (byte *)pToUArgs->sourceLimit;
  uVar10 = CONCAT71((int7)((ulong)in_RAX >> 8),(char)cnv->options) & 0xffffffffffffff10;
  puStack_c0 = (uint8_t *)CONCAT71((int7)(uVar10 >> 8),pUVar18->toULength);
  if (pUVar18->toULength < '\x01') {
    local_a4 = 0;
    prev = 0;
    puStack_c0 = (uint8_t *)0x0;
  }
  else {
    local_a4 = (uint)CONCAT71((int7)((ulong)in_R8 >> 8),(char)pUVar18->mode);
    prev = pUVar18->toUnicodeStatus;
  }
  pUVar5 = cnv->sharedData;
  iVar16 = (((uint)puStack_c0 & 0xff) - (int)(char)local_a4) + ((int)local_88 - (int)pbVar19);
  if ((0 < iVar16) && (bVar2 = local_88[-1], (char)bVar2 < '\0')) {
    if ((iVar16 == 1) || (0xbf < bVar2)) {
      if ((byte)(bVar2 + 0x3e) < 0x2e) {
        local_88 = local_88 + -1;
      }
    }
    else if (((local_88[-2] & 0xf0) == 0xe0) &&
            (local_80 = local_88 + -2,
            ((byte)" 000000000000\x1000"[local_88[-2] & 0xf] >> (bVar2 >> 5) & 1) != 0)) {
      local_88 = local_80;
    }
  }
  uVar17 = *(int *)&pFromUArgs->targetLimit - (int)target;
  local_40 = (pUVar5->mbcs).fromUnicodeTable;
  local_78 = (pUVar5->mbcs).mbcsIndex;
  local_90 = *(long *)((pUVar5->mbcs).sbcsIndex + (uVar10 >> 4 & 0xf) * 4 + 0x40);
  local_64 = (pUVar5->mbcs).asciiRoundtrips;
  bVar2 = (pUVar5->mbcs).unicodeMask;
  local_a0 = pToUArgs;
  if (prev == 0) goto LAB_002b4b74;
  if ((int)uVar17 < 1) goto LAB_002b4b74;
  pUVar18->toUnicodeStatus = 0;
  pUVar18->toULength = '\0';
  uVar10 = (ulong)puStack_c0 & 0xffffffff;
LAB_002b4d25:
  local_94 = (uint)uVar10;
  iVar16 = (int)(char)local_a4;
  local_68 = local_a4 & 0xff;
  uVar10 = (ulong)puStack_c0 & 0xff;
  local_80 = pbVar19;
  local_70 = pFromUArgs;
  local_60 = uVar10;
  local_58 = pErrorCode;
  local_50 = pUVar18;
  local_48 = cnv;
  if ((char)local_a4 <= (char)puStack_c0) {
    local_68 = (uint)uVar10;
  }
  for (; uVar13 = (uint)uVar10, uVar14 = local_68, (int)uVar13 < iVar16; uVar10 = uVar10 + 1) {
    if (local_a0->sourceLimit <= pbVar19) {
      for (uVar9 = (ulong)(byte)local_94; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        local_50->toUBytes[uVar9] = local_80[uVar9 - local_60];
      }
      local_50->toUnicodeStatus = prev;
      local_50->toULength = (int8_t)uVar10;
      local_50->mode = iVar16;
      local_a0->source = (char *)(local_80 + (uVar9 - local_60));
      local_70->target = (char *)target;
      return;
    }
    bVar3 = *pbVar19;
    UVar7 = icu_63::UTF8::isValidTrail(prev,bVar3,uVar13,iVar16);
    uVar14 = uVar13;
    if (UVar7 == '\0') break;
    pbVar19 = pbVar19 + 1;
    prev = prev * 0x40 + (uint)bVar3;
  }
  if ((char)uVar14 != (char)local_a4) {
    for (uVar10 = (ulong)(local_94 & 0xff); uVar10 < (uVar14 & 0xff); uVar10 = uVar10 + 1) {
      local_50->toUBytes[uVar10] = local_80[uVar10 - local_60];
    }
    local_50->toULength = (char)uVar14;
    local_a0->source = (char *)(local_80 + (uVar10 - local_60));
    local_70->target = (char *)target;
    *local_58 = U_ILLEGAL_CHAR_FOUND;
    return;
  }
  prev = prev - utf8_offsets[iVar16];
  if (((char)local_a4 < '\x04') || (uVar14 = 0, (bVar2 & 1) != 0)) {
    uVar14 = *(uint *)(local_40 + (ulong)((prev >> 4 & 0x3f) + (uint)local_40[(int)prev >> 10]) * 2)
    ;
  }
  uVar10 = (ulong)*(ushort *)(local_90 + (ulong)((uVar14 & 0xffff) << 4 | prev & 0xf) * 2);
  pFromUArgs = local_70;
  cnv = local_48;
  pUVar18 = local_50;
  pErrorCode = local_58;
  if (((uVar14 >> (sbyte)(prev & 0xf)) >> 0x10 & 1) != 0) goto LAB_002b4ed6;
  if (((local_48->useFallback == '\0') && (0x18ff < prev - 0xe000)) && (0x1ffff < prev - 0xf0000))
  goto LAB_002b4f89;
LAB_002b4ecd:
  if ((short)uVar10 == 0) goto LAB_002b4f89;
LAB_002b4ed6:
  uVar8 = (uint8_t)uVar10;
  if ((ushort)uVar10 < 0x100) {
    *target = uVar8;
    puStack_c0 = (uint8_t *)0xffffffffffffffff;
    target = target + 1;
  }
  else {
    puVar1 = target + 1;
    *target = (uint8_t)(uVar10 >> 8);
    if ((int)uVar17 < 2) {
      cnv->charErrorBuffer[0] = uVar8;
      cnv->charErrorBufferLength = '\x01';
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      target = puVar1;
LAB_002b4c00:
      local_a0->source = (char *)pbVar19;
      pFromUArgs->target = (char *)target;
      return;
    }
    target = target + 2;
    *puVar1 = uVar8;
    puStack_c0 = (uint8_t *)0xfffffffffffffffe;
  }
  uVar17 = uVar17 + (int)puStack_c0;
LAB_002b4b74:
  do {
    while( true ) {
      pbVar20 = pbVar19 + 1;
      if (local_88 <= pbVar19) {
        UVar12 = *pErrorCode;
        pbVar20 = pbVar19;
        goto LAB_002b4bc0;
      }
      if ((int)uVar17 < 1) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_002b4c00;
      }
      bVar3 = *pbVar19;
      prev = (uint32_t)bVar3;
      if ((char)bVar3 < '\0') break;
      if ((local_64 >> (bVar3 >> 2 & 0x1f) & 1) == 0) {
        uVar10 = (ulong)*(ushort *)(local_90 + (ulong)(*local_78 + prev) * 2);
        pbVar19 = pbVar20;
        goto LAB_002b4ecd;
      }
      *target = bVar3;
      uVar17 = uVar17 - 1;
      puStack_c0 = target;
      pbVar19 = pbVar20;
      target = target + 1;
    }
    uVar11 = (undefined7)((ulong)puStack_c0 >> 8);
    if (0xdf < bVar3) {
      if (bVar3 < 0xee) {
        puStack_c0 = (uint8_t *)(ulong)(prev & 0xf);
        if (((puStack_c0[0x300429] >> (*pbVar20 >> 5) & 1) != 0) &&
           (uVar14 = pbVar19[2] ^ 0x80, (byte)uVar14 < 0x40)) {
          uVar13 = *pbVar20 & 0x3f | (prev & 0xf) << 6;
          pbVar19 = pbVar19 + 3;
          uVar4 = *(ushort *)(local_90 + (ulong)(local_78[uVar13] + uVar14) * 2);
          if (uVar4 == 0) {
            prev = uVar13 << 6 | uVar14;
            goto LAB_002b4f89;
          }
          break;
        }
      }
      else {
        puStack_c0 = (uint8_t *)CONCAT71(uVar11,1);
        local_a4 = 0;
        if (0x32 < (byte)(bVar3 + 0x3e)) goto LAB_002b4d23;
      }
LAB_002b4d10:
      local_a4 = (uint)CONCAT71((int7)((ulong)puStack_c0 >> 8),
                                ((0xdf < bVar3) - (bVar3 < 0xf0)) + '\x03');
      puStack_c0 = (uint8_t *)0x1;
LAB_002b4d23:
      uVar10 = 0;
      pbVar19 = pbVar20;
      goto LAB_002b4d25;
    }
    puStack_c0 = (uint8_t *)CONCAT71(uVar11,1);
    local_a4 = 0;
    if (bVar3 < 0xc2) goto LAB_002b4d23;
    uVar14 = *pbVar20 ^ 0x80;
    if (0x3f < (byte)uVar14) goto LAB_002b4d10;
    pbVar19 = pbVar19 + 2;
    uVar4 = *(ushort *)(local_90 + (ulong)(local_78[prev & 0x1f] + uVar14) * 2);
    if (uVar4 != 0) break;
    prev = (prev & 0x1f) << 6 | uVar14;
LAB_002b4f89:
    noSource = L"";
    uVar17 = _extFromU(cnv,cnv->sharedData,prev,&noSource,L"",&target,target + uVar17,
                       (int32_t **)0x0,-1,pFromUArgs->flush,pErrorCode);
    puStack_c0 = (uint8_t *)(ulong)uVar17;
    UVar12 = *pErrorCode;
    pbVar20 = pbVar19;
    if (U_ZERO_ERROR < UVar12) {
      cnv->fromUChar32 = uVar17;
LAB_002b4bc0:
      pbVar19 = pbVar20;
      if (((UVar12 < U_ILLEGAL_ARGUMENT_ERROR) && (cnv->preFromUFirstCP < 0)) &&
         (pbVar6 = (byte *)local_a0->sourceLimit, pbVar20 < pbVar6)) {
        bVar2 = *pbVar20;
        uVar17 = (uint)bVar2;
        pUVar18->toUBytes[0] = bVar2;
        if ((char)bVar2 < '\0') {
          iVar16 = 0;
          if ((byte)(bVar2 + 0x3e) < 0x33) {
            iVar16 = ((uint)(0xdf < bVar2) - (uint)(bVar2 < 0xf0)) + 3;
          }
        }
        else {
          iVar16 = 1;
        }
        lVar15 = 1;
        while( true ) {
          pbVar19 = pbVar20 + lVar15;
          if (pbVar6 <= pbVar19) break;
          bVar2 = *pbVar19;
          pUVar18->toUBytes[(char)lVar15] = bVar2;
          uVar17 = uVar17 * 0x40 + (uint)bVar2;
          lVar15 = lVar15 + 1;
        }
        pUVar18->toUnicodeStatus = uVar17;
        pUVar18->toULength = (char)lVar15;
        pUVar18->mode = iVar16;
      }
      goto LAB_002b4c00;
    }
    if (-1 < cnv->preFromUFirstCP) {
      *pErrorCode = U_USING_DEFAULT_WARNING;
      UVar12 = U_USING_DEFAULT_WARNING;
      goto LAB_002b4bc0;
    }
    uVar17 = *(int *)&pFromUArgs->targetLimit - (int)target;
  } while( true );
  uVar10 = (ulong)uVar4;
  goto LAB_002b4ed6;
}

Assistant:

static void U_CALLCONV
ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *mbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t stage2Entry;
    uint32_t asciiRoundtrips;
    uint16_t value = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    mbcsIndex=cnv->sharedData->mbcs.mbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /* See note in ucnv_SBCSFromUTF8() about this goto. */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=b;
                    --targetCapacity;
                    continue;
                } else {
                    value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, 0, b);
                    if(value==0) {
                        c=b;
                        goto unassigned;
                    }
                }
            } else {
                if(b>=0xe0) {
                    if( /* handle U+0800..U+D7FF inline */
                        b<=0xed &&  // do not assume maxFastUChar>0xd7ff
                        U8_IS_VALID_LEAD3_AND_T1(b, t1=source[0]) &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=((b&0xf)<<6)|(t1&0x3f);
                        source+=2;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t2);
                        if(value==0) {
                            c=(c<<6)|t2;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t1);
                        if(value==0) {
                            c=(c<<6)|t1;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                stage2Entry=0;
                            } else {
                                stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }

                    /* get the bytes and the length for the output */
                    /* MBCS_OUTPUT_2 */
                    value=MBCS_VALUE_2_FROM_STAGE_2(results, stage2Entry, c);

                    /* is this code point assigned, or do we use fallbacks? */
                    if(!(MBCS_FROM_U_IS_ROUNDTRIP(stage2Entry, c) ||
                         (UCNV_FROM_U_USE_FALLBACK(cnv, c) && value!=0))
                    ) {
                        goto unassigned;
                    }
                }
            }

            /* write the output character bytes from value and length */
            /* from the first if in the loop we know that targetCapacity>0 */
            if(value<=0xff) {
                /* this is easy because we know that there is enough space */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else /* length==2 */ {
                *target++=(uint8_t)(value>>8);
                if(2<=targetCapacity) {
                    *target++=(uint8_t)value;
                    targetCapacity-=2;
                } else {
                    cnv->charErrorBuffer[0]=(char)value;
                    cnv->charErrorBufferLength=1;

                    /* target overflow */
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
            continue;

unassigned:
            {
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                    continue;
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}